

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic-memalign.cpp
# Opt level: O2

void * generic_xxmemalign(size_t alignment,size_t size)

{
  ulong uVar1;
  void *pvVar2;
  
  uVar1 = alignment - 1;
  if (uVar1 < (alignment ^ uVar1)) {
    pvVar2 = xxmalloc(size);
    if ((0x10 < alignment) && (((ulong)pvVar2 & uVar1) != 0)) {
      xxfree(pvVar2);
      pvVar2 = xxmalloc(size + alignment * 2);
      pvVar2 = (void *)((long)pvVar2 + (alignment - 1) & -alignment);
    }
  }
  else {
    pvVar2 = (void *)0x0;
  }
  return pvVar2;
}

Assistant:

void * generic_xxmemalign(size_t alignment, size_t size) {
  // Check for non power-of-two alignment.
  if ((alignment == 0) || (alignment & (alignment - 1)))
    {
      return nullptr;
    }

  if (alignment <= alignof(max_align_t)) {
    // Already aligned by default.
    return xxmalloc(size);
  } else {
    // Try to just allocate an object of the requested size.
    // If it happens to be aligned properly, just return it.
    void * ptr = xxmalloc(size);
    if (((size_t) ptr & ~(alignment - 1)) == (size_t) ptr) {
      // It is already aligned just fine; return it.
      return ptr;
    }
    // It was not aligned as requested: free the object and allocate a big one,
    // and align within.
    xxfree(ptr);
    ptr = xxmalloc (size + 2 * alignment);
    void * alignedPtr = (void *) (((size_t) ptr + alignment - 1) & ~(alignment - 1));
    return alignedPtr;
  }
}